

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_settings(lws *wsi,http2_settings *settings,uchar *buf,int len)

{
  uint uVar1;
  uint uVar2;
  lws *wsi_00;
  lws *local_48;
  lws *w;
  uint b;
  uint a;
  lws *nwsi;
  uchar *puStack_28;
  int len_local;
  uchar *buf_local;
  http2_settings *settings_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  if (len == 0) {
    wsi_local._4_4_ = 0;
  }
  else {
    nwsi._4_4_ = len;
    puStack_28 = buf;
    if (len < 6) {
      wsi_local._4_4_ = 1;
    }
    else {
      for (; 5 < nwsi._4_4_; nwsi._4_4_ = nwsi._4_4_ + -6) {
        uVar2 = (uint)CONCAT11(*puStack_28,puStack_28[1]);
        if ((uVar2 != 0) && (uVar2 < 9)) {
          uVar1 = *(uint *)(puStack_28 + 2);
          w._0_4_ = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          switch(uVar2) {
          case 1:
            break;
          case 2:
            if (1 < (uint)w) {
              lws_h2_goaway(wsi_00,1,"ENABLE_PUSH invalid arg");
              return 1;
            }
            break;
          case 3:
            break;
          case 4:
            if (0x7fffffff < (uint)w) {
              lws_h2_goaway(wsi_00,3,"Inital Window beyond max");
              return 1;
            }
            if (((wsi->flags & 0x40U) == 0) || ((uint)w != 0x7fffffff)) {
              for (local_48 = (wsi_00->mux).child_list; local_48 != (lws *)0x0;
                  local_48 = (local_48->mux).sibling_list) {
                _lws_log(8,"%s: adi child tc cr %d +%d -> %d","lws_h2_settings",
                         (ulong)(uint)(local_48->txc).tx_cr,(ulong)((uint)w - settings->s[uVar2]),
                         (ulong)(((local_48->txc).tx_cr + (uint)w) - settings->s[uVar2]));
                (local_48->txc).tx_cr = ((uint)w - settings->s[uVar2]) + (local_48->txc).tx_cr;
                if ((0 < (local_48->txc).tx_cr) &&
                   ((local_48->txc).tx_cr <= (int)((uint)w - settings->s[uVar2]))) {
                  lws_callback_on_writable(local_48);
                }
              }
            }
            else {
              w._0_4_ = 0x7ffffff;
            }
            break;
          case 5:
            if ((uint)w < (wsi->vhost->h2).set.s[5]) {
              lws_h2_goaway(wsi_00,1,"Frame size < initial");
              return 1;
            }
            if (0xffffff < (uint)w) {
              lws_h2_goaway(wsi_00,1,"Settings Frame size above max");
              return 1;
            }
            break;
          case 6:
          }
          settings->s[uVar2] = (uint)w;
          _lws_log(8,"http2 settings %d <- 0x%x\n",(ulong)uVar2,(ulong)(uint)w);
        }
        puStack_28 = puStack_28 + 6;
      }
      if (nwsi._4_4_ == 0) {
        lws_h2_dump_settings(settings);
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_h2_settings(struct lws *wsi, struct http2_settings *settings,
		unsigned char *buf, int len)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	unsigned int a, b;

	if (!len)
		return 0;

	if (len < LWS_H2_SETTINGS_LEN)
		return 1;

	while (len >= LWS_H2_SETTINGS_LEN) {
		a = (buf[0] << 8) | buf[1];
		if (!a || a >= H2SET_COUNT)
			goto skip;
		b = buf[2] << 24 | buf[3] << 16 | buf[4] << 8 | buf[5];

		switch (a) {
		case H2SET_HEADER_TABLE_SIZE:
			break;
		case H2SET_ENABLE_PUSH:
			if (b > 1) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "ENABLE_PUSH invalid arg");
				return 1;
			}
			break;
		case H2SET_MAX_CONCURRENT_STREAMS:
			break;
		case H2SET_INITIAL_WINDOW_SIZE:
			if (b > 0x7fffffff) {
				lws_h2_goaway(nwsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Inital Window beyond max");
				return 1;
			}

#if defined(LWS_WITH_CLIENT)
#if defined(LWS_AMAZON_RTOS) || defined(LWS_AMAZON_LINUX)
			if (
#else
			if (wsi->flags & LCCSCF_H2_QUIRK_OVERFLOWS_TXCR &&
#endif
			    b == 0x7fffffff) {
				b >>= 4;

				break;
			}
#endif

			/*
			 * In addition to changing the flow-control window for
			 * streams that are not yet active, a SETTINGS frame
			 * can alter the initial flow-control window size for
			 * streams with active flow-control windows (that is,
			 * streams in the "open" or "half-closed (remote)"
			 * state).  When the value of
			 * SETTINGS_INITIAL_WINDOW_SIZE changes, a receiver
			 * MUST adjust the size of all stream flow-control
			 * windows that it maintains by the difference between
			 * the new value and the old value.
			 */

			lws_start_foreach_ll(struct lws *, w,
					     nwsi->mux.child_list) {
				lwsl_info("%s: adi child tc cr %d +%d -> %d",
					  __func__, (int)w->txc.tx_cr,
					  b - (unsigned int)settings->s[a],
					  (int)w->txc.tx_cr + b -
						  (unsigned int)settings->s[a]);
				w->txc.tx_cr += b - settings->s[a];
				if (w->txc.tx_cr > 0 &&
				    w->txc.tx_cr <=
						  (int32_t)(b - settings->s[a]))

					lws_callback_on_writable(w);
			} lws_end_foreach_ll(w, mux.sibling_list);

			break;
		case H2SET_MAX_FRAME_SIZE:
			if (b < wsi->vhost->h2.set.s[H2SET_MAX_FRAME_SIZE]) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Frame size < initial");
				return 1;
			}
			if (b > 0x00ffffff) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Settings Frame size above max");
				return 1;
			}
			break;
		case H2SET_MAX_HEADER_LIST_SIZE:
			break;
		}
		settings->s[a] = b;
		lwsl_info("http2 settings %d <- 0x%x\n", a, b);
skip:
		len -= LWS_H2_SETTINGS_LEN;
		buf += LWS_H2_SETTINGS_LEN;
	}

	if (len)
		return 1;

	lws_h2_dump_settings(settings);

	return 0;
}